

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  Particle<(pica::Dimension)2> particle;
  int i;
  uint uVar1;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  AssertHelper local_140;
  int numParticles;
  AssertionResult gtest_ar;
  Particle local_120;
  ParticleArray particles;
  
  memset(&particles,0,0xc0);
  numParticles = 0xc;
  for (uVar1 = 0; uVar1 < 0xc; uVar1 = uVar1 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (&local_120,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this);
    particle.position.y = local_120.position.y;
    particle.position.x = local_120.position.x;
    particle.p.x = local_120.p.x;
    particle.p.y = local_120.p.y;
    particle.p.z = local_120.p.z;
    particle.factor = local_120.factor;
    particle.invGamma = local_120.invGamma;
    particle.typeIndex = local_120.typeIndex;
    particle._58_6_ = local_120._58_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)2>> *)&particles,particle);
  }
  local_148.ptr_._0_4_ =
       (undefined4)
       ((ulong)((long)particles.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)particles.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"numParticles","particles.size()",&numParticles,(int *)&local_148
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_148);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x45,message);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_148);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA(&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}